

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

XML_Bool storeRawNames(XML_Parser parser)

{
  TAG *pTVar1;
  char *pcVar2;
  XML_Char *pXVar3;
  int iVar4;
  XML_Char *pXVar5;
  long lVar6;
  char *pcVar7;
  char *__dest;
  size_t sVar8;
  
  pTVar1 = parser->m_tagStack;
  while( true ) {
    if (pTVar1 == (TAG *)0x0) {
      return '\x01';
    }
    lVar6 = (long)(pTVar1->name).strLen;
    pcVar7 = pTVar1->rawName;
    pcVar2 = pTVar1->buf;
    __dest = pcVar2 + lVar6 + 1;
    if (pcVar7 == __dest) break;
    lVar6 = lVar6 + 1;
    iVar4 = pTVar1->rawNameLength;
    sVar8 = (size_t)(iVar4 + (int)lVar6);
    if ((long)pTVar1->bufEnd - (long)pcVar2 < (long)sVar8) {
      pXVar5 = (XML_Char *)(*(parser->m_mem).realloc_fcn)(pcVar2,sVar8);
      if (pXVar5 == (XML_Char *)0x0) {
        return '\0';
      }
      pcVar7 = pTVar1->buf;
      if ((pTVar1->name).str == pcVar7) {
        (pTVar1->name).str = pXVar5;
      }
      pXVar3 = (pTVar1->name).localPart;
      if (pXVar3 != (XML_Char *)0x0) {
        (pTVar1->name).localPart = pXVar5 + ((long)pXVar3 - (long)pcVar7);
      }
      pTVar1->buf = pXVar5;
      pTVar1->bufEnd = pXVar5 + sVar8;
      __dest = pXVar5 + lVar6;
      pcVar7 = pTVar1->rawName;
      iVar4 = pTVar1->rawNameLength;
    }
    memcpy(__dest,pcVar7,(long)iVar4);
    pTVar1->rawName = __dest;
    pTVar1 = pTVar1->parent;
  }
  return '\x01';
}

Assistant:

static XML_Bool
storeRawNames(XML_Parser parser)
{
  TAG *tag = parser->m_tagStack;
  while (tag) {
    int bufSize;
    int nameLen = sizeof(XML_Char) * (tag->name.strLen + 1);
    char *rawNameBuf = tag->buf + nameLen;
    /* Stop if already stored.  Since m_tagStack is a stack, we can stop
       at the first entry that has already been copied; everything
       below it in the stack is already been accounted for in a
       previous call to this function.
    */
    if (tag->rawName == rawNameBuf)
      break;
    /* For re-use purposes we need to ensure that the
       size of tag->buf is a multiple of sizeof(XML_Char).
    */
    bufSize = nameLen + ROUND_UP(tag->rawNameLength, sizeof(XML_Char));
    if (bufSize > tag->bufEnd - tag->buf) {
      char *temp = (char *)REALLOC(parser, tag->buf, bufSize);
      if (temp == NULL)
        return XML_FALSE;
      /* if tag->name.str points to tag->buf (only when namespace
         processing is off) then we have to update it
      */
      if (tag->name.str == (XML_Char *)tag->buf)
        tag->name.str = (XML_Char *)temp;
      /* if tag->name.localPart is set (when namespace processing is on)
         then update it as well, since it will always point into tag->buf
      */
      if (tag->name.localPart)
        tag->name.localPart = (XML_Char *)temp + (tag->name.localPart -
                                                  (XML_Char *)tag->buf);
      tag->buf = temp;
      tag->bufEnd = temp + bufSize;
      rawNameBuf = temp + nameLen;
    }
    memcpy(rawNameBuf, tag->rawName, tag->rawNameLength);
    tag->rawName = rawNameBuf;
    tag = tag->parent;
  }
  return XML_TRUE;
}